

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O2

int secp256k1_rangeproof_genrand
              (secp256k1_scalar *sec,secp256k1_scalar *s,uchar *message,size_t *rsizes,size_t rings,
              uchar *nonce,secp256k1_ge *commit,uchar *proof,size_t len,secp256k1_ge *genp)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t extraout_RDX_03;
  size_t extraout_RDX_04;
  size_t extraout_RDX_05;
  size_t extraout_RDX_06;
  size_t sVar6;
  uint uVar7;
  long lVar8;
  secp256k1_scalar *psVar9;
  ulong uVar10;
  int overflow;
  uchar *local_178;
  ulong local_170;
  secp256k1_scalar *local_168;
  ulong local_160;
  secp256k1_scalar *local_158;
  uchar *local_150;
  size_t *local_148;
  ulong local_140;
  secp256k1_scalar local_138;
  byte local_118 [44];
  secp256k1_rfc6979_hmac_sha256 local_ec;
  uchar rngseed [108];
  
  rngseed._0_8_ = *(undefined8 *)nonce;
  rngseed._8_8_ = *(undefined8 *)(nonce + 8);
  rngseed._16_8_ = *(undefined8 *)(nonce + 0x10);
  rngseed._24_8_ = *(undefined8 *)(nonce + 0x18);
  local_168 = sec;
  local_158 = s;
  local_148 = rsizes;
  secp256k1_rangeproof_serialize_point(rngseed + 0x20,commit);
  secp256k1_rangeproof_serialize_point(rngseed + 0x41,genp);
  memcpy(rngseed + 0x62,proof,len);
  secp256k1_rfc6979_hmac_sha256_initialize(&local_ec,rngseed,len + 0x62);
  local_138.d[2] = 0;
  local_138.d[3] = 0;
  local_138.d[0] = 0;
  local_138.d[1] = 0;
  local_170 = rings - 1;
  uVar7 = 1;
  lVar8 = 0;
  sVar6 = extraout_RDX;
  local_160 = rings;
  local_150 = message;
  for (local_140 = 0; local_140 != local_160; local_140 = local_140 + 1) {
    psVar9 = local_168 + local_140;
    local_178 = message;
    if (local_140 < local_170) {
      secp256k1_rfc6979_hmac_sha256_generate(&local_ec,local_118,sVar6);
      sVar6 = extraout_RDX_00;
      do {
        do {
          secp256k1_rfc6979_hmac_sha256_generate(&local_ec,local_118,sVar6);
          secp256k1_scalar_set_b32(psVar9,local_118,&overflow);
          sVar6 = extraout_RDX_01;
        } while (overflow != 0);
        iVar3 = secp256k1_scalar_is_zero(psVar9);
        sVar6 = extraout_RDX_02;
      } while (iVar3 != 0);
      secp256k1_scalar_add(&local_138,&local_138,psVar9);
      sVar6 = extraout_RDX_03;
      message = local_178;
    }
    else {
      secp256k1_scalar_negate(&local_138,&local_138);
      psVar9->d[2] = local_138.d[2];
      psVar9->d[3] = local_138.d[3];
      psVar9->d[0] = local_138.d[0];
      psVar9->d[1] = local_138.d[1];
      sVar6 = extraout_RDX_04;
    }
    for (uVar10 = 0; uVar10 < local_148[local_140]; uVar10 = uVar10 + 1) {
      secp256k1_rfc6979_hmac_sha256_generate(&local_ec,local_118,sVar6);
      if (local_150 != (uchar *)0x0) {
        for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 1) {
          bVar1 = local_118[lVar5];
          bVar2 = message[lVar5];
          local_118[lVar5] = bVar1 ^ bVar2;
          message[lVar5] = bVar1 ^ bVar2;
        }
      }
      psVar9 = local_158 + lVar8;
      secp256k1_scalar_set_b32(psVar9,local_118,&overflow);
      uVar4 = 0;
      sVar6 = extraout_RDX_05;
      if (overflow == 0) {
        uVar4 = secp256k1_scalar_is_zero(psVar9);
        uVar4 = uVar4 ^ 1;
        sVar6 = extraout_RDX_06;
      }
      uVar7 = uVar7 & uVar4;
      lVar8 = lVar8 + 1;
      message = message + 0x20;
    }
    message = local_178 + 0x80;
  }
  return uVar7;
}

Assistant:

SECP256K1_INLINE static int secp256k1_rangeproof_genrand(secp256k1_scalar *sec, secp256k1_scalar *s, unsigned char *message,
 size_t *rsizes, size_t rings, const unsigned char *nonce, const secp256k1_ge *commit, const unsigned char *proof, size_t len, const secp256k1_ge* genp) {
    unsigned char tmp[32];
    unsigned char rngseed[32 + 33 + 33 + 10];
    secp256k1_rfc6979_hmac_sha256 rng;
    secp256k1_scalar acc;
    int overflow;
    int ret;
    size_t i;
    size_t j;
    int b;
    size_t npub;
    VERIFY_CHECK(len <= 10);
    memcpy(rngseed, nonce, 32);
    secp256k1_rangeproof_serialize_point(rngseed + 32, commit);
    secp256k1_rangeproof_serialize_point(rngseed + 32 + 33, genp);
    memcpy(rngseed + 33 + 33 + 32, proof, len);
    secp256k1_rfc6979_hmac_sha256_initialize(&rng, rngseed, 32 + 33 + 33 + len);
    secp256k1_scalar_clear(&acc);
    npub = 0;
    ret = 1;
    for (i = 0; i < rings; i++) {
        if (i < rings - 1) {
            secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
            do {
                secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
                secp256k1_scalar_set_b32(&sec[i], tmp, &overflow);
            } while (overflow || secp256k1_scalar_is_zero(&sec[i]));
            secp256k1_scalar_add(&acc, &acc, &sec[i]);
        } else {
            secp256k1_scalar_negate(&acc, &acc);
            sec[i] = acc;
        }
        for (j = 0; j < rsizes[i]; j++) {
            secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
            if (message) {
                for (b = 0; b < 32; b++) {
                    tmp[b] ^= message[(i * 4 + j) * 32 + b];
                    message[(i * 4 + j) * 32 + b] = tmp[b];
                }
            }
            secp256k1_scalar_set_b32(&s[npub], tmp, &overflow);
            ret &= !(overflow || secp256k1_scalar_is_zero(&s[npub]));
            npub++;
        }
    }
    secp256k1_rfc6979_hmac_sha256_finalize(&rng);
    secp256k1_scalar_clear(&acc);
    memset(tmp, 0, 32);
    return ret;
}